

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeResumeThrow
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,Name tag,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels
          )

{
  Name tag_00;
  Name name;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *handlerTags;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  Tag *this_00;
  size_t size;
  Err *pEVar4;
  ResumeTable *handlerBlocks;
  ResumeTable *pRVar5;
  ResumeThrow *expr;
  optional<wasm::HeapType> ct_00;
  Ok local_319;
  IRBuilder *local_318;
  char *pcStack_310;
  Err local_308;
  Err *local_2e8;
  Err *err_2;
  undefined1 local_2d8 [8];
  Result<wasm::Ok> _val_2;
  Err *err_1;
  undefined1 local_280;
  undefined3 uStack_27f;
  ChildPopper local_278;
  undefined1 local_270 [8];
  Result<wasm::Ok> _val_1;
  Err local_240;
  Err *local_220;
  Err *err;
  Result<wasm::ResumeTable> _val;
  function<wasm::Result<wasm::Type>_(unsigned_int)> local_1d8;
  anon_class_8_1_8991fb9c local_1b8;
  function<wasm::Result<wasm::Name>_(unsigned_int)> local_1b0;
  undefined1 local_190 [8];
  Result<wasm::ResumeTable> resumetable;
  Type local_148;
  undefined1 local_140 [8];
  ResumeThrow curr;
  Err local_90;
  allocator<char> local_59;
  Err local_58;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_38;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *tags_local;
  IRBuilder *this_local;
  Name tag_local;
  HeapType ct_local;
  
  tag_local.super_IString.str._M_len = tag.super_IString.str._M_str;
  this_local = tag.super_IString.str._M_len;
  local_38 = tags;
  tags_local = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)this;
  tag_local.super_IString.str._M_str = (char *)ct.id;
  sVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(tags);
  sVar3 = std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::
          size(labels);
  if (sVar2 == sVar3) {
    bVar1 = HeapType::isContinuation((HeapType *)&tag_local.super_IString.str._M_str);
    if (bVar1) {
      ResumeThrow::ResumeThrow((ResumeThrow *)local_140,&this->wasm->allocator);
      wasm::Name::operator=
                ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)94>.super_Expression.
                          type,(Name *)&this_local);
      resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = this_local;
      name.super_IString.str._M_str = (char *)tag_local.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)this_local;
      this_00 = Module::getTag(this->wasm,name);
      local_148 = wasm::Tag::params(this_00);
      size = wasm::Type::size(&local_148);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 &curr.handlerBlocks.allocator,size);
      local_1b8.this = this;
      std::function<wasm::Result<wasm::Name>(unsigned_int)>::
      function<wasm::IRBuilder::makeResumeThrow(wasm::HeapType,wasm::Name,std::vector<wasm::Name,std::allocator<wasm::Name>>const&,std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>const&)::__0,void>
                ((function<wasm::Result<wasm::Name>(unsigned_int)> *)&local_1b0,&local_1b8);
      _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = this;
      std::function<wasm::Result<wasm::Type>(unsigned_int)>::
      function<wasm::IRBuilder::makeResumeThrow(wasm::HeapType,wasm::Name,std::vector<wasm::Name,std::allocator<wasm::Name>>const&,std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>const&)::__1,void>
                ((function<wasm::Result<wasm::Type>(unsigned_int)> *)&local_1d8,
                 (anon_class_8_1_8991fb9c *)
                 ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                         super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
      makeResumeTable((Result<wasm::ResumeTable> *)local_190,labels,&local_1b0,&local_1d8);
      std::function<wasm::Result<wasm::Type>_(unsigned_int)>::~function(&local_1d8);
      std::function<wasm::Result<wasm::Name>_(unsigned_int)>::~function(&local_1b0);
      Result<wasm::ResumeTable>::Result
                ((Result<wasm::ResumeTable> *)&err,(Result<wasm::ResumeTable> *)local_190);
      local_220 = Result<wasm::ResumeTable>::getErr((Result<wasm::ResumeTable> *)&err);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_220 != (Err *)0x0;
      if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
        wasm::Err::Err(&local_240,local_220);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_240);
        wasm::Err::~Err(&local_240);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      Result<wasm::ResumeTable>::~Result((Result<wasm::ResumeTable> *)&err);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        ChildPopper::ChildPopper(&local_278,this);
        std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
                  ((optional<wasm::HeapType> *)&err_1,
                   (HeapType *)&tag_local.super_IString.str._M_str);
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)err_1;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_280;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_27f;
        ChildPopper::visitResumeThrow
                  ((Result<wasm::Ok> *)local_270,&local_278,(ResumeThrow *)local_140,ct_00);
        pEVar4 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_270);
        if (pEVar4 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar4);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar4 != (Err *)0x0;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_270);
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          err_2 = (Err *)tag_local.super_IString.str._M_str;
          anon_unknown_282::validateTypeAnnotation
                    ((Result<wasm::Ok> *)local_2d8,(HeapType)tag_local.super_IString.str._M_str,
                     (Expression *)curr.operands.allocator);
          local_2e8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_2d8);
          bVar1 = local_2e8 != (Err *)0x0;
          if (bVar1) {
            wasm::Err::Err(&local_308,local_2e8);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_308);
            wasm::Err::~Err(&local_308);
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar1;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_2d8);
          handlerTags = local_38;
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            local_318 = this_local;
            pcStack_310 = (char *)tag_local.super_IString.str._M_len;
            handlerBlocks =
                 Result<wasm::ResumeTable>::operator->((Result<wasm::ResumeTable> *)local_190);
            pRVar5 = Result<wasm::ResumeTable>::operator->((Result<wasm::ResumeTable> *)local_190);
            tag_00.super_IString.str._M_str = pcStack_310;
            tag_00.super_IString.str._M_len = (size_t)local_318;
            expr = Builder::makeResumeThrow
                             (&this->builder,tag_00,handlerTags,&handlerBlocks->targets,
                              &pRVar5->sentTypes,(ExpressionList *)&curr.handlerBlocks.allocator,
                              (Expression *)curr.operands.allocator);
            push(this,(Expression *)expr);
            Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_319);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
          }
        }
      }
      Result<wasm::ResumeTable>::~Result((Result<wasm::ResumeTable> *)local_190);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"expected continuation type",
                 (allocator<char> *)((long)&curr.sentTypes.allocator + 7));
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_90);
      wasm::Err::~Err(&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&curr.sentTypes.allocator + 7));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"the sizes of tags and labels must be equal",&local_59);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_58);
    wasm::Err::~Err(&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeResumeThrow(HeapType ct,
                           Name tag,
                           const std::vector<Name>& tags,
                           const std::vector<std::optional<Index>>& labels) {
  if (tags.size() != labels.size()) {
    return Err{"the sizes of tags and labels must be equal"};
  }
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }

  ResumeThrow curr(wasm.allocator);
  curr.tag = tag;
  curr.operands.resize(wasm.getTag(tag)->params().size());

  Result<ResumeTable> resumetable = makeResumeTable(
    labels,
    [this](Index i) { return this->getLabelName(i); },
    [this](Index i) { return this->getLabelType(i); });
  CHECK_ERR(resumetable);
  CHECK_ERR(ChildPopper{*this}.visitResumeThrow(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeResumeThrow(tag,
                               tags,
                               resumetable->targets,
                               resumetable->sentTypes,
                               std::move(curr.operands),
                               curr.cont));
  return Ok{};
}